

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O1

HighsInt __thiscall HEkkDualRow::debugChooseColumnInfeasibilities(HEkkDualRow *this)

{
  int iVar1;
  HEkk *pHVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  HighsInt HVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> unpack_value;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  undefined8 uStack_30;
  
  pHVar2 = this->ekk_instance_;
  if ((pHVar2->options_->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar6 = 0;
  }
  else {
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (&local_58,(long)(pHVar2->lp_).num_row_ + (long)(pHVar2->lp_).num_col_);
    iVar1 = this->packCount;
    if (0 < (long)iVar1) {
      piVar3 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[piVar3[lVar7]] = pdVar4[lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar1 != lVar7);
    }
    if (this->workCount < 1) {
      HVar6 = 0;
    }
    else {
      dVar10 = -(this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance
      ;
      lVar7 = 0;
      uVar8 = 0;
      HVar6 = 0;
      uStack_30 = 0x8000000000000000;
      local_38 = dVar10;
      do {
        lVar5 = (long)*(int *)((long)&((this->workData).
                                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar7);
        dVar9 = this->workTheta *
                local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        if ((double)-(int)this->workMove[lVar5] * (this->workDual[lVar5] - dVar9) < dVar10) {
          printf("%3d: iCol = %4d; dual = %11.4g; value = %11.4g; move = %2d; delta = %11.4g; new_dual = %11.4g; infeasibility = %11.4g: %d\n"
                 ,this->workDual[lVar5],
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5],ABS(dVar9),uVar8 & 0xffffffff,lVar5,
                 (ulong)(uint)(int)this->workMove[lVar5],1);
          HVar6 = HVar6 + 1;
          dVar10 = local_38;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while ((long)uVar8 < (long)this->workCount);
    }
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return HVar6;
}

Assistant:

HighsInt HEkkDualRow::debugChooseColumnInfeasibilities() const {
  HighsInt num_infeasibility = 0;
  if (ekk_instance_.options_->highs_debug_level < kHighsDebugLevelCheap)
    return num_infeasibility;
  std::vector<double> unpack_value;
  HighsLp& lp = ekk_instance_.lp_;
  unpack_value.resize(lp.num_col_ + lp.num_row_);
  for (HighsInt ix = 0; ix < packCount; ix++)
    unpack_value[packIndex[ix]] = packValue[ix];
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  for (HighsInt i = 0; i < workCount; i++) {
    const HighsInt iCol = workData[i].first;
    const double value = unpack_value[iCol];
    const HighsInt move = workMove[iCol];
    const double dual = workDual[iCol];
    const double delta_dual = fabs(workTheta * value);
    const double new_dual = dual - workTheta * value;
    const double infeasibility_after_flip = -move * new_dual;
    const bool infeasible = infeasibility_after_flip < -Td;
    if (infeasible) {
      printf(
          "%3d: iCol = %4d; dual = %11.4g; value = %11.4g; move = %2d; delta = "
          "%11.4g; new_dual = %11.4g; infeasibility = %11.4g: %d\n",
          (int)i, (int)iCol, dual, value, (int)move, delta_dual, new_dual,
          infeasibility_after_flip, infeasible);

      num_infeasibility++;
    }
  }
  assert(!num_infeasibility);
  return num_infeasibility;
}